

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_7427e9::HandleRuntimeDependencySetMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer *ppbVar1;
  cmExecutionStatus *this;
  undefined8 this_00;
  bool bVar2;
  int iVar3;
  string *psVar4;
  cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
  *pcVar5;
  cmArgumentParser<ArgVectors> *pcVar6;
  reference b;
  ulong uVar7;
  cmGlobalGenerator *pcVar8;
  cmInstallRuntimeDependencySet *runtimeDependencySet_00;
  static_string_view sVar9;
  bool local_c95;
  bool local_c93;
  bool local_c91;
  RuntimeDependenciesArgs local_bf8;
  bool local_b4c;
  bool local_b4b;
  bool local_b4a;
  allocator<char> local_b49;
  undefined1 local_b48 [4];
  bool installsFramework;
  bool installsLibrary;
  bool installsRuntime;
  string local_b28;
  ParseResult local_b08;
  ParseResult local_ad8;
  ParseResult local_aa8;
  undefined1 local_a78 [8];
  RuntimeDependenciesArgs runtimeDependencyArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  undefined1 local_998 [8];
  cmInstallCommandArguments frameworkArgs;
  undefined1 local_7c0 [8];
  cmInstallCommandArguments runtimeArgs;
  undefined1 local_5e8 [8];
  cmInstallCommandArguments libraryArgs;
  undefined1 local_428 [7];
  bool success;
  string_view local_3f8;
  string local_3e8;
  undefined1 local_3c8 [8];
  cmInstallCommandArguments genericArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDependencyArgVector;
  string runtimeDependencySetArg;
  ArgVectors argVectors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genericArgVector;
  cmArgumentParser<ArgVectors> local_148;
  cmInstallRuntimeDependencySet *local_d8;
  cmInstallRuntimeDependencySet *runtimeDependencySet;
  string local_c8;
  allocator<char> local_91;
  string local_90;
  undefined1 local_70 [8];
  string system;
  Helper helper;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  helper.DefaultComponentName.field_2._8_8_ = status;
  Helper::Helper((Helper *)((long)&system.field_2 + 8),status);
  this = helper.Status;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_HOST_SYSTEM_NAME",&local_91);
  psVar4 = cmMakefile::GetSafeDefinition((cmMakefile *)this,&local_90);
  std::__cxx11::string::string((string *)local_70,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  bVar2 = cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies((string *)local_70);
  this_00 = helper.DefaultComponentName.field_2._8_8_;
  if (bVar2) {
    if ((anonymous_namespace)::
        HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::argHelper == '\0') {
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::argHelper);
      if (iVar3 != 0) {
        local_148.super_Base.Bindings.Positions.
        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_148.super_Base.Bindings.Positions.
        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_148.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
        local_148.super_Base.Bindings.Positions.
        super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        .
        super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
        local_148.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager =
             (_Manager_type)0x0;
        local_148.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
        local_148.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused.
        _M_object = (void *)0x0;
        local_148.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
        local_148.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
             (_Manager_type)0x0;
        local_148.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_148.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
        _M_object = (void *)0x0;
        local_148.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_148.super_Base.Bindings.Keywords.
        super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        .
        super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        cmArgumentParser<ArgVectors>::cmArgumentParser(&local_148);
        sVar9 = ::cm::operator____s("LIBRARY",7);
        pcVar5 = (cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                  *)cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                    ::
                    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                                *)&local_148,sVar9,0);
        sVar9 = ::cm::operator____s("RUNTIME",7);
        pcVar5 = (cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                  *)cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                    ::
                    Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (pcVar5,sVar9,0x18);
        sVar9 = ::cm::operator____s("FRAMEWORK",9);
        pcVar6 = cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                 ::
                 Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           (pcVar5,sVar9,0x30);
        cmArgumentParser<ArgVectors>::cmArgumentParser
                  (&HandleRuntimeDependencySetMode::argHelper,pcVar6);
        cmArgumentParser<ArgVectors>::~cmArgumentParser(&local_148);
        __cxa_atexit(cmArgumentParser<ArgVectors>::~cmArgumentParser,
                     &HandleRuntimeDependencySetMode::argHelper,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::argHelper);
      }
    }
    ppbVar1 = &argVectors.Framework.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppbVar1);
    cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
    ::Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((ArgVectors *)((long)&runtimeDependencySetArg.field_2 + 8),
               (cmArgumentParser<(anonymous_namespace)::HandleRuntimeDependencySetMode(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::ArgVectors>
                *)&HandleRuntimeDependencySetMode::argHelper,args,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1,0);
    std::__cxx11::string::string
              ((string *)
               &runtimeDependencyArgVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&genericArgs.DefaultComponentName.field_2 + 8));
    std::__cxx11::string::string((string *)&local_3e8,(string *)&helper.Makefile);
    cmInstallCommandArguments::cmInstallCommandArguments
              ((cmInstallCommandArguments *)local_3c8,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    local_3f8 = (string_view)::cm::operator____s("RUNTIME_DEPENDENCY_SET",0x16);
    cmArgumentParser<void>::Bind<std::__cxx11::string>
              ((cmArgumentParser<void> *)local_3c8,(static_string_view)local_3f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &runtimeDependencyArgVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmArgumentParser<void>::
    Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((ParseResult *)local_428,(cmArgumentParser<void> *)local_3c8,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&argVectors.Framework.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&genericArgs.DefaultComponentName.field_2 + 8),0);
    ArgumentParser::ParseResult::~ParseResult((ParseResult *)local_428);
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] =
         cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_3c8);
    std::__cxx11::string::string
              ((string *)(runtimeArgs.DefaultComponentName.field_2._M_local_buf + 8),
               (string *)&helper.Makefile);
    cmInstallCommandArguments::cmInstallCommandArguments
              ((cmInstallCommandArguments *)local_5e8,
               (string *)((long)&runtimeArgs.DefaultComponentName.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)(runtimeArgs.DefaultComponentName.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)(frameworkArgs.DefaultComponentName.field_2._M_local_buf + 8),
               (string *)&helper.Makefile);
    cmInstallCommandArguments::cmInstallCommandArguments
              ((cmInstallCommandArguments *)local_7c0,
               (string *)((long)&frameworkArgs.DefaultComponentName.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)(frameworkArgs.DefaultComponentName.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)
               &unknownArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&helper.Makefile);
    cmInstallCommandArguments::cmInstallCommandArguments
              ((cmInstallCommandArguments *)local_998,
               (string *)
               &unknownArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &unknownArgs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ppbVar1 = &runtimeDependencyArgs.PostExcludeFiles.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ppbVar1);
    cmArgumentParser<(anonymous_namespace)::RuntimeDependenciesArgs>::
    Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((RuntimeDependenciesArgs *)local_a78,
               (cmArgumentParser<(anonymous_namespace)::RuntimeDependenciesArgs> *)
               (anonymous_namespace)::RuntimeDependenciesArgHelper,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&genericArgs.DefaultComponentName.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)ppbVar1,0);
    cmArgumentParser<void>::
    Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_aa8,(cmArgumentParser<void> *)local_5e8,
               (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&runtimeDependencySetArg.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&runtimeDependencyArgs.PostExcludeFiles.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    ArgumentParser::ParseResult::~ParseResult(&local_aa8);
    cmArgumentParser<void>::
    Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_ad8,(cmArgumentParser<void> *)local_7c0,
               (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&argVectors.Library.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&runtimeDependencyArgs.PostExcludeFiles.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    ArgumentParser::ParseResult::~ParseResult(&local_ad8);
    cmArgumentParser<void>::
    Parse<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (&local_b08,(cmArgumentParser<void> *)local_998,
               (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&argVectors.Runtime.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&runtimeDependencyArgs.PostExcludeFiles.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    ArgumentParser::ParseResult::~ParseResult(&local_b08);
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_5e8,(cmInstallCommandArguments *)local_3c8);
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_7c0,(cmInstallCommandArguments *)local_3c8);
    cmInstallCommandArguments::SetGenericArguments
              ((cmInstallCommandArguments *)local_998,(cmInstallCommandArguments *)local_3c8);
    local_c91 = false;
    if ((libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_c91 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_5e8);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_c91;
    local_c93 = false;
    if (local_c91 != false) {
      local_c93 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_7c0);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_c93;
    local_c95 = false;
    if (local_c93 != false) {
      local_c95 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_998);
    }
    libraryArgs.DefaultComponentName.field_2._M_local_buf[0xf] = local_c95;
    if (local_c95 == false) {
      args_local._7_1_ = false;
    }
    else {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&runtimeDependencyArgs.PostExcludeFiles.
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          runtimeDependencySet_00 =
               cmGlobalGenerator::GetNamedRuntimeDependencySet
                         (pcVar8,(string *)
                                 &runtimeDependencyArgVector.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_b4a = false;
          local_b4b = false;
          local_b4c = false;
          local_d8 = runtimeDependencySet_00;
          RuntimeDependenciesArgs::RuntimeDependenciesArgs
                    (&local_bf8,(RuntimeDependenciesArgs *)local_a78);
          AddInstallRuntimeDependenciesGenerator
                    ((Helper *)((long)&system.field_2 + 8),runtimeDependencySet_00,
                     (cmInstallCommandArguments *)local_7c0,(cmInstallCommandArguments *)local_5e8,
                     (cmInstallCommandArguments *)local_998,&local_bf8,&local_b4a,&local_b4b,
                     &local_b4c);
          RuntimeDependenciesArgs::~RuntimeDependenciesArgs(&local_bf8);
          if ((local_b4b & 1U) != 0) {
            pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
            psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                               ((cmInstallCommandArguments *)local_5e8);
            cmGlobalGenerator::AddInstallComponent(pcVar8,psVar4);
          }
          if ((local_b4a & 1U) != 0) {
            pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
            psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                               ((cmInstallCommandArguments *)local_7c0);
            cmGlobalGenerator::AddInstallComponent(pcVar8,psVar4);
          }
          if ((local_b4c & 1U) != 0) {
            pcVar8 = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
            psVar4 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                               ((cmInstallCommandArguments *)local_998);
            cmGlobalGenerator::AddInstallComponent(pcVar8,psVar4);
          }
          args_local._7_1_ = true;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_b48,
                     "RUNTIME_DEPENDENCY_SET not given a runtime dependency set.",&local_b49);
          Helper::SetError((Helper *)((long)&system.field_2 + 8),(string *)local_b48);
          std::__cxx11::string::~string((string *)local_b48);
          std::allocator<char>::~allocator(&local_b49);
          args_local._7_1_ = false;
        }
      }
      else {
        b = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&runtimeDependencyArgs.PostExcludeFiles.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmStrCat<char_const(&)[48],std::__cxx11::string&,char_const(&)[3]>
                  (&local_b28,(char (*) [48])"RUNTIME_DEPENDENCY_SET given unknown argument \"",b,
                   (char (*) [3])0x104275a);
        Helper::SetError((Helper *)((long)&system.field_2 + 8),&local_b28);
        std::__cxx11::string::~string((string *)&local_b28);
        args_local._7_1_ = false;
      }
    }
    runtimeDependencySet._0_4_ = 1;
    RuntimeDependenciesArgs::~RuntimeDependenciesArgs((RuntimeDependenciesArgs *)local_a78);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&runtimeDependencyArgs.PostExcludeFiles.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_998);
    cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_7c0);
    cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_5e8);
    cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_3c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&genericArgs.DefaultComponentName.field_2 + 8));
    std::__cxx11::string::~string
              ((string *)
               &runtimeDependencyArgVector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    HandleRuntimeDependencySetMode::ArgVectors::~ArgVectors
              ((ArgVectors *)((long)&runtimeDependencySetArg.field_2 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&argVectors.Framework.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    runtimeDependencySet._7_1_ = 0x22;
    cmStrCat<char_const(&)[52],std::__cxx11::string&,char>
              (&local_c8,(char (*) [52])0x1010518,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               (char *)((long)&runtimeDependencySet + 7));
    cmExecutionStatus::SetError((cmExecutionStatus *)this_00,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    args_local._7_1_ = false;
    runtimeDependencySet._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_70);
  Helper::~Helper((Helper *)((long)&system.field_2 + 8));
  return args_local._7_1_;
}

Assistant:

bool HandleRuntimeDependencySetMode(std::vector<std::string> const& args,
                                    cmExecutionStatus& status)
{
  Helper helper(status);

  auto system = helper.Makefile->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
  if (!cmRuntimeDependencyArchive::PlatformSupportsRuntimeDependencies(
        system)) {
    status.SetError(cmStrCat(
      "RUNTIME_DEPENDENCY_SET is not supported on system \"", system, '"'));
    return false;
  }

  // This is the RUNTIME_DEPENDENCY_SET mode.
  cmInstallRuntimeDependencySet* runtimeDependencySet;

  struct ArgVectors
  {
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Library;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Runtime;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Framework;
  };

  static auto const argHelper = cmArgumentParser<ArgVectors>{}
                                  .Bind("LIBRARY"_s, &ArgVectors::Library)
                                  .Bind("RUNTIME"_s, &ArgVectors::Runtime)
                                  .Bind("FRAMEWORK"_s, &ArgVectors::Framework);

  std::vector<std::string> genericArgVector;
  ArgVectors const argVectors = argHelper.Parse(args, &genericArgVector);

  // now parse the generic args (i.e. the ones not specialized on LIBRARY,
  // RUNTIME, FRAMEWORK etc. (see above)
  // These generic args also contain the runtime dependency set
  std::string runtimeDependencySetArg;
  std::vector<std::string> runtimeDependencyArgVector;
  cmInstallCommandArguments genericArgs(helper.DefaultComponentName);
  genericArgs.Bind("RUNTIME_DEPENDENCY_SET"_s, runtimeDependencySetArg);
  genericArgs.Parse(genericArgVector, &runtimeDependencyArgVector);
  bool success = genericArgs.Finalize();

  cmInstallCommandArguments libraryArgs(helper.DefaultComponentName);
  cmInstallCommandArguments runtimeArgs(helper.DefaultComponentName);
  cmInstallCommandArguments frameworkArgs(helper.DefaultComponentName);

  // Now also parse the file(GET_RUNTIME_DEPENDENCY) args
  std::vector<std::string> unknownArgs;
  auto runtimeDependencyArgs = RuntimeDependenciesArgHelper.Parse(
    runtimeDependencyArgVector, &unknownArgs);

  // now parse the args for specific parts of the target (e.g. LIBRARY,
  // RUNTIME, FRAMEWORK etc.
  libraryArgs.Parse(argVectors.Library, &unknownArgs);
  runtimeArgs.Parse(argVectors.Runtime, &unknownArgs);
  frameworkArgs.Parse(argVectors.Framework, &unknownArgs);

  libraryArgs.SetGenericArguments(&genericArgs);
  runtimeArgs.SetGenericArguments(&genericArgs);
  frameworkArgs.SetGenericArguments(&genericArgs);

  success = success && libraryArgs.Finalize();
  success = success && runtimeArgs.Finalize();
  success = success && frameworkArgs.Finalize();

  if (!success) {
    return false;
  }

  if (!unknownArgs.empty()) {
    helper.SetError(
      cmStrCat("RUNTIME_DEPENDENCY_SET given unknown argument \"",
               unknownArgs.front(), "\"."));
    return false;
  }

  if (runtimeDependencySetArg.empty()) {
    helper.SetError(
      "RUNTIME_DEPENDENCY_SET not given a runtime dependency set.");
    return false;
  }

  runtimeDependencySet =
    helper.Makefile->GetGlobalGenerator()->GetNamedRuntimeDependencySet(
      runtimeDependencySetArg);

  bool installsRuntime = false;
  bool installsLibrary = false;
  bool installsFramework = false;

  AddInstallRuntimeDependenciesGenerator(
    helper, runtimeDependencySet, runtimeArgs, libraryArgs, frameworkArgs,
    std::move(runtimeDependencyArgs), installsRuntime, installsLibrary,
    installsFramework);

  // Tell the global generator about any installation component names
  // specified
  if (installsLibrary) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      libraryArgs.GetComponent());
  }
  if (installsRuntime) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      runtimeArgs.GetComponent());
  }
  if (installsFramework) {
    helper.Makefile->GetGlobalGenerator()->AddInstallComponent(
      frameworkArgs.GetComponent());
  }

  return true;
}